

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Cn cn)

{
  char *pcVar1;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  bool local_32;
  bool local_31;
  bool local_21;
  UInt local_20;
  bool local_1a;
  bool local_19;
  bool upper;
  StrWriter *pSStack_18;
  bool valid;
  StrWriter *this_local;
  Cn cn_local;
  
  local_21 = true;
  if (7 < cn.raw) {
    local_31 = 0x7ff < cn.raw && cn.raw < 0x808;
    local_21 = local_31;
  }
  local_19 = local_21;
  local_32 = false;
  if (this->style->syntax != GNU) {
    local_32 = this->style->syntax != GNU_MIT;
  }
  local_1a = local_32;
  pSStack_18 = this;
  this_local._6_2_ = cn.raw;
  if (local_21 == false) {
    if (((this->style->syntax == MUSASHI) || (this->style->syntax == GNU)) ||
       (this->style->syntax == GNU_MIT)) {
      UInt::UInt(&local_20,(uint)cn.raw);
      operator<<(this,local_20);
    }
    else {
      operator<<(this,"INVALID");
    }
  }
  else {
    if ((this->style->syntax == GNU_MIT) || (this->style->syntax == MOIRA_MIT)) {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = '%';
    }
    if (cn.raw == 0) {
      if (local_32 == false) {
        local_40 = "sfc";
      }
      else {
        local_40 = "SFC";
      }
      operator<<(this,local_40);
    }
    else if (cn.raw == 1) {
      if (local_32 == false) {
        local_48 = "dfc";
      }
      else {
        local_48 = "DFC";
      }
      operator<<(this,local_48);
    }
    else if (cn.raw == 2) {
      if (local_32 == false) {
        local_50 = "cacr";
      }
      else {
        local_50 = "CACR";
      }
      operator<<(this,local_50);
    }
    else if (cn.raw == 3) {
      if (local_32 == false) {
        local_58 = "tc";
      }
      else {
        local_58 = "TC";
      }
      operator<<(this,local_58);
    }
    else if (cn.raw == 4) {
      if (local_32 == false) {
        local_60 = "itt0";
      }
      else {
        local_60 = "ITT0";
      }
      operator<<(this,local_60);
    }
    else if (cn.raw == 5) {
      if (local_32 == false) {
        local_68 = "itt1";
      }
      else {
        local_68 = "ITT1";
      }
      operator<<(this,local_68);
    }
    else if (cn.raw == 6) {
      if (local_32 == false) {
        local_70 = "dtt0";
      }
      else {
        local_70 = "DTT0";
      }
      operator<<(this,local_70);
    }
    else if (cn.raw == 7) {
      if (local_32 == false) {
        local_78 = "dtt1";
      }
      else {
        local_78 = "DTT1";
      }
      operator<<(this,local_78);
    }
    else if (cn.raw == 8) {
      if (local_32 == false) {
        local_80 = "buscr";
      }
      else {
        local_80 = "BUSCR";
      }
      operator<<(this,local_80);
    }
    else if (cn.raw == 0x800) {
      if (local_32 == false) {
        local_88 = "usp";
      }
      else {
        local_88 = "USP";
      }
      operator<<(this,local_88);
    }
    else if (cn.raw == 0x801) {
      if (local_32 == false) {
        local_90 = "vbr";
      }
      else {
        local_90 = "VBR";
      }
      operator<<(this,local_90);
    }
    else if (cn.raw == 0x802) {
      if (local_32 == false) {
        local_98 = "caar";
      }
      else {
        local_98 = "CAAR";
      }
      operator<<(this,local_98);
    }
    else if (cn.raw == 0x803) {
      if (local_32 == false) {
        local_a0 = "msp";
      }
      else {
        local_a0 = "MSP";
      }
      operator<<(this,local_a0);
    }
    else if (cn.raw == 0x804) {
      if (local_32 == false) {
        local_a8 = "isp";
      }
      else {
        local_a8 = "ISP";
      }
      operator<<(this,local_a8);
    }
    else if (cn.raw == 0x805) {
      if (local_32 == false) {
        local_b0 = "mmusr";
      }
      else {
        local_b0 = "MMUSR";
      }
      operator<<(this,local_b0);
    }
    else if (cn.raw == 0x806) {
      if (local_32 == false) {
        local_b8 = "urp";
      }
      else {
        local_b8 = "URP";
      }
      operator<<(this,local_b8);
    }
    else if (cn.raw == 0x807) {
      if (local_32 == false) {
        local_c0 = "srp";
      }
      else {
        local_c0 = "SRP";
      }
      operator<<(this,local_c0);
    }
    else if (cn.raw == 0x808) {
      if (local_32 == false) {
        local_c8 = "pcr";
      }
      else {
        local_c8 = "PCR";
      }
      operator<<(this,local_c8);
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Cn cn)
{
    bool valid = cn.raw <= 0x007 || (cn.raw >= 0x800 && cn.raw <= 0x807);
    bool upper = style.syntax != Syntax::GNU && style.syntax != Syntax::GNU_MIT;

    if (valid) {

        if (style.syntax == Syntax::GNU_MIT || style.syntax == Syntax::MOIRA_MIT) {
            *ptr++ = '%';
        }

        switch (cn.raw) {

            case 0x000: *this << (upper ? "SFC"   : "sfc");   break;
            case 0x001: *this << (upper ? "DFC"   : "dfc");   break;
            case 0x002: *this << (upper ? "CACR"  : "cacr");  break;
            case 0x003: *this << (upper ? "TC"    : "tc");    break;
            case 0x004: *this << (upper ? "ITT0"  : "itt0");  break;
            case 0x005: *this << (upper ? "ITT1"  : "itt1");  break;
            case 0x006: *this << (upper ? "DTT0"  : "dtt0");  break;
            case 0x007: *this << (upper ? "DTT1"  : "dtt1");  break;
            case 0x008: *this << (upper ? "BUSCR" : "buscr"); break;
            case 0x800: *this << (upper ? "USP"   : "usp");   break;
            case 0x801: *this << (upper ? "VBR"   : "vbr");   break;
            case 0x802: *this << (upper ? "CAAR"  : "caar");  break;
            case 0x803: *this << (upper ? "MSP"   : "msp");   break;
            case 0x804: *this << (upper ? "ISP"   : "isp");   break;
            case 0x805: *this << (upper ? "MMUSR" : "mmusr"); break;
            case 0x806: *this << (upper ? "URP"   : "urp");   break;
            case 0x807: *this << (upper ? "SRP"   : "srp");   break;
            case 0x808: *this << (upper ? "PCR"   : "pcr");   break;
        }

    } else {

        if (style.syntax == Syntax::MUSASHI || style.syntax == Syntax::GNU || style.syntax == Syntax::GNU_MIT) {
            *this << UInt(cn.raw);
        } else {
            *this << "INVALID";
        }
    }

    return *this;
}